

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

int __thiscall
btGeneric6DofSpring2Constraint::setAngularLimits
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo2 *info,int row_offset,
          btTransform *transA,btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,
          btVector3 *angVelA,btVector3 *angVelB)

{
  uint uVar1;
  int iVar2;
  int in_EDX;
  long in_RSI;
  btGeneric6DofSpring2Constraint *in_RDI;
  btVector3 *in_stack_00000038;
  btVector3 *in_stack_00000040;
  btTransform *in_stack_00000048;
  btTransform *in_stack_00000050;
  int flags;
  btVector3 axis;
  int i;
  int ii;
  int cIdx [3];
  int row;
  int in_stack_00000098;
  int local_5c;
  int local_58 [12];
  long local_28;
  
  local_58[0] = 0;
  local_58[1] = 1;
  local_58[2] = 2;
  switch(in_RDI->m_rotateOrder) {
  case RO_XYZ:
    local_58[0] = 0;
    local_58[1] = 1;
    local_58[2] = 2;
    break;
  case RO_XZY:
    local_58[0] = 0;
    local_58[1] = 2;
    local_58[2] = 1;
    break;
  case RO_YXZ:
    local_58[0] = 1;
    local_58[1] = 0;
    local_58[2] = 2;
    break;
  case RO_YZX:
    local_58[0] = 1;
    local_58[1] = 2;
    local_58[2] = 0;
    break;
  case RO_ZXY:
    local_58[0] = 2;
    local_58[1] = 0;
    local_58[2] = 1;
    break;
  case RO_ZYX:
    local_58[0] = 2;
    local_58[1] = 1;
    local_58[2] = 0;
  }
  local_5c = 0;
  local_58[3] = in_EDX;
  local_28 = in_RSI;
  while( true ) {
    if (2 < local_5c) break;
    iVar2 = local_58[local_5c];
    if (((in_RDI->m_angularLimits[iVar2].m_currentLimit != 0) ||
        ((in_RDI->m_angularLimits[iVar2].m_enableMotor & 1U) != 0)) ||
       ((in_RDI->m_angularLimits[iVar2].m_enableSpring & 1U) != 0)) {
      getAxis(in_RDI,iVar2);
      uVar1 = in_RDI->m_flags >> (((char)iVar2 + '\x03') * '\x04' & 0x1fU);
      if ((uVar1 & 1) == 0) {
        in_RDI->m_angularLimits[iVar2].m_stopCFM = **(btScalar **)(local_28 + 0x38);
      }
      if ((uVar1 & 2) == 0) {
        in_RDI->m_angularLimits[iVar2].m_stopERP = *(btScalar *)(local_28 + 4);
      }
      if ((uVar1 & 4) == 0) {
        in_RDI->m_angularLimits[iVar2].m_motorCFM = **(btScalar **)(local_28 + 0x38);
      }
      if ((uVar1 & 8) == 0) {
        in_RDI->m_angularLimits[iVar2].m_motorERP = *(btScalar *)(local_28 + 4);
      }
      iVar2 = get_limit_motor_info2
                        ((btGeneric6DofSpring2Constraint *)axis.m_floats._8_8_,
                         (btRotationalLimitMotor2 *)axis.m_floats._0_8_,in_stack_00000050,
                         in_stack_00000048,in_stack_00000040,in_stack_00000038,
                         (btVector3 *)cIdx._0_8_,stack0x00000078,(btConstraintInfo2 *)linVelA,
                         (int)transB,(btVector3 *)transA,in_stack_00000098,(int)info);
      local_58[3] = iVar2 + local_58[3];
    }
    local_5c = local_5c + 1;
  }
  return local_58[3];
}

Assistant:

int btGeneric6DofSpring2Constraint::setAngularLimits(btConstraintInfo2 *info, int row_offset, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	int row = row_offset;

	//order of rotational constraint rows
	int cIdx[] = {0, 1, 2};
	switch(m_rotateOrder)
	{
		case RO_XYZ : cIdx[0] = 0; cIdx[1] = 1; cIdx[2] = 2; break;
		case RO_XZY : cIdx[0] = 0; cIdx[1] = 2; cIdx[2] = 1; break;
		case RO_YXZ : cIdx[0] = 1; cIdx[1] = 0; cIdx[2] = 2; break;
		case RO_YZX : cIdx[0] = 1; cIdx[1] = 2; cIdx[2] = 0; break;
		case RO_ZXY : cIdx[0] = 2; cIdx[1] = 0; cIdx[2] = 1; break;
		case RO_ZYX : cIdx[0] = 2; cIdx[1] = 1; cIdx[2] = 0; break;
		default : btAssert(false);
	}

	for (int ii = 0; ii < 3 ; ii++ )
	{
		int i = cIdx[ii];
		if(m_angularLimits[i].m_currentLimit || m_angularLimits[i].m_enableMotor || m_angularLimits[i].m_enableSpring)
		{
			btVector3 axis = getAxis(i);
			int flags = m_flags >> ((i + 3) * BT_6DOF_FLAGS_AXIS_SHIFT2);
			if(!(flags & BT_6DOF_FLAGS_CFM_STOP2))
			{
				m_angularLimits[i].m_stopCFM = info->cfm[0];
			}
			if(!(flags & BT_6DOF_FLAGS_ERP_STOP2))
			{
				m_angularLimits[i].m_stopERP = info->erp;
			}
			if(!(flags & BT_6DOF_FLAGS_CFM_MOTO2))
			{
				m_angularLimits[i].m_motorCFM = info->cfm[0];
			}
			if(!(flags & BT_6DOF_FLAGS_ERP_MOTO2))
			{
				m_angularLimits[i].m_motorERP = info->erp;
			}
			row += get_limit_motor_info2(&m_angularLimits[i],transA,transB,linVelA,linVelB,angVelA,angVelB, info,row,axis,1);
		}
	}

	return row;
}